

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O3

ssize_t filemgr_write_blocks(filemgr *file,void *buf,uint num_blocks,bid_t start_bid)

{
  int iVar1;
  _func_ssize_t_int_void_ptr_size_t_cs_off_t *p_Var2;
  long lVar3;
  fdb_status fVar4;
  undefined1 *dst_buf;
  ssize_t sVar5;
  ulong blocksize;
  undefined1 *dst_buf_00;
  ulong __size;
  undefined8 uStack_60;
  undefined1 auStack_58 [8];
  long local_50;
  bid_t local_48;
  void *local_40;
  encryptor *local_38;
  
  dst_buf_00 = auStack_58;
  blocksize = (ulong)file->blocksize;
  local_50 = blocksize * start_bid;
  __size = num_blocks * blocksize;
  if ((file->encryption).ops == (encryption_ops *)0x0) {
    sVar5 = (*file->ops->pwrite)(file->fd,buf,__size,local_50);
    return sVar5;
  }
  if (__size < 0x1001) {
    lVar3 = -(__size + 0xf & 0xfffffffffffffff0);
    dst_buf_00 = auStack_58 + lVar3;
    *(undefined8 *)(auStack_58 + lVar3 + -8) = 0x116803;
    fVar4 = fdb_encrypt_blocks(&file->encryption,dst_buf_00,buf,blocksize,num_blocks,start_bid);
    dst_buf = dst_buf_00;
  }
  else {
    uStack_60 = 0x11678d;
    local_48 = start_bid;
    local_40 = buf;
    local_38 = &file->encryption;
    dst_buf = (undefined1 *)malloc(__size);
    if (dst_buf == (undefined1 *)0x0) {
      return -8;
    }
    uStack_60 = 0x1167b3;
    fVar4 = fdb_encrypt_blocks(local_38,dst_buf,local_40,blocksize,num_blocks,local_48);
    uStack_60 = 0x1167bd;
    free(dst_buf);
  }
  lVar3 = local_50;
  if (fVar4 == FDB_RESULT_SUCCESS) {
    iVar1 = file->fd;
    p_Var2 = file->ops->pwrite;
    *(undefined8 *)(dst_buf_00 + -8) = 0x116826;
    sVar5 = (*p_Var2)(iVar1,dst_buf,__size,lVar3);
  }
  else {
    sVar5 = (ssize_t)fVar4;
  }
  return sVar5;
}

Assistant:

ssize_t filemgr_write_blocks(struct filemgr *file, void *buf, unsigned num_blocks, bid_t start_bid) {
    size_t blocksize = file->blocksize;
    cs_off_t offset = start_bid * blocksize;
    size_t nbytes = num_blocks * blocksize;
    if (file->encryption.ops == NULL) {
        return file->ops->pwrite(file->fd, buf, nbytes, offset);
    } else {
        uint8_t *encrypted_buf;
        if (nbytes > 4096)
            encrypted_buf = (uint8_t*)malloc(nbytes);
        else
            encrypted_buf = alca(uint8_t, nbytes); // most common case (writing single block)
        if (!encrypted_buf)
            return FDB_RESULT_ALLOC_FAIL;
        fdb_status status = fdb_encrypt_blocks(&file->encryption,
                                               encrypted_buf,
                                               buf,
                                               blocksize,
                                               num_blocks,
                                               start_bid);
        if (nbytes > 4096)
            free(encrypted_buf);
        if (status != FDB_RESULT_SUCCESS)
            return status;
        return file->ops->pwrite(file->fd, encrypted_buf, nbytes, offset);
    }
}